

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cc
# Opt level: O1

bool __thiscall
google::protobuf::compiler::Parser::ParseFieldOptions
          (Parser *this,FieldDescriptorProto *field,LocationRecorder *field_location,
          FileDescriptorProto *containing_file)

{
  ulong uVar1;
  bool bVar2;
  int iVar3;
  FieldOptions *pFVar4;
  FileDescriptorProto *containing_file_00;
  Arena *arena;
  LocationRecorder location;
  LocationRecorder LStack_48;
  
  containing_file_00 = containing_file;
  iVar3 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
  bVar2 = true;
  if (iVar3 == 0) {
    LocationRecorder::LocationRecorder(&LStack_48,field_location,8);
    bVar2 = Consume(this,"[");
    if (bVar2) {
      do {
        iVar3 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
        if (iVar3 == 0) {
          bVar2 = ParseDefaultAssignment(this,field,field_location,containing_file_00);
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)&(this->input_->current_).text);
          if (iVar3 == 0) {
            bVar2 = ParseJsonName(this,field,field_location,containing_file_00);
          }
          else {
            *(byte *)(field->_has_bits_).has_bits_ = (byte)(field->_has_bits_).has_bits_[0] | 0x20;
            if (field->options_ == (FieldOptions *)0x0) {
              uVar1 = (field->super_Message).super_MessageLite._internal_metadata_.ptr_;
              arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
              if ((uVar1 & 1) != 0) {
                arena = *(Arena **)arena;
              }
              pFVar4 = Arena::CreateMaybeMessage<google::protobuf::FieldOptions>(arena);
              field->options_ = pFVar4;
            }
            containing_file_00 = containing_file;
            bVar2 = ParseOption(this,&field->options_->super_Message,&LStack_48,containing_file,
                                OPTION_ASSIGNMENT);
          }
        }
        if (bVar2 == false) goto LAB_003448e3;
        bVar2 = TryConsume(this,",");
      } while (bVar2);
      bVar2 = Consume(this,"]");
    }
    else {
LAB_003448e3:
      bVar2 = false;
    }
    LocationRecorder::~LocationRecorder(&LStack_48);
  }
  return bVar2;
}

Assistant:

bool Parser::ParseFieldOptions(FieldDescriptorProto* field,
                               const LocationRecorder& field_location,
                               const FileDescriptorProto* containing_file) {
  if (!LookingAt("[")) return true;

  LocationRecorder location(field_location,
                            FieldDescriptorProto::kOptionsFieldNumber);

  DO(Consume("["));

  // Parse field options.
  do {
    if (LookingAt("default")) {
      // We intentionally pass field_location rather than location here, since
      // the default value is not actually an option.
      DO(ParseDefaultAssignment(field, field_location, containing_file));
    } else if (LookingAt("json_name")) {
      // Like default value, this "json_name" is not an actual option.
      DO(ParseJsonName(field, field_location, containing_file));
    } else {
      DO(ParseOption(field->mutable_options(), location, containing_file,
                     OPTION_ASSIGNMENT));
    }
  } while (TryConsume(","));

  DO(Consume("]"));
  return true;
}